

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O0

pre_order_iterator
htmlcxx2::HTML::
rfindTag<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
          (pre_order_iterator it,pre_order_iterator rend,string *tag)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  char *s1;
  char *s2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  pre_order_iterator pVar6;
  string *tag_local;
  pre_order_iterator rend_local;
  pre_order_iterator it_local;
  
  tag_local = (string *)rend.super_iterator_base.node;
  rend_local.super_iterator_base._8_8_ = it.super_iterator_base.node;
  rend_local.super_iterator_base.node._0_1_ = rend.super_iterator_base.skip_current_children_;
  uVar1 = it.super_iterator_base.skip_current_children_;
  do {
    bVar2 = kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::
            pre_order_iterator::operator!=
                      ((pre_order_iterator *)&rend_local.super_iterator_base.skip_current_children_,
                       (pre_order_iterator *)&tag_local);
    if (!bVar2) {
      it_local.super_iterator_base._8_8_ = tag_local;
      uVar5 = extraout_RDX;
      uVar1 = rend_local.super_iterator_base.node._0_1_;
LAB_001d62ed:
      pVar6.super_iterator_base._9_7_ = (undefined7)((ulong)uVar5 >> 8);
      pVar6.super_iterator_base.skip_current_children_ = (bool)uVar1;
      pVar6.super_iterator_base.node = (tree_node *)it_local.super_iterator_base._8_8_;
      return (pre_order_iterator)pVar6.super_iterator_base;
    }
    pNVar4 = kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>
             ::iterator_base::operator->
                       ((iterator_base *)&rend_local.super_iterator_base.skip_current_children_);
    bVar2 = Node::isTag(pNVar4);
    if (bVar2) {
      pNVar4 = kp::
               tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::
               iterator_base::operator->
                         ((iterator_base *)&rend_local.super_iterator_base.skip_current_children_);
      Node::tagName_abi_cxx11_(pNVar4);
      s1 = (char *)std::__cxx11::string::c_str();
      s2 = (char *)std::__cxx11::string::c_str();
      iVar3 = impl::icompare<char>(s1,s2);
      if (iVar3 == 0) {
        it_local.super_iterator_base.skip_current_children_ =
             rend_local.super_iterator_base.skip_current_children_;
        it_local.super_iterator_base._9_7_ = rend_local.super_iterator_base._9_7_;
        uVar5 = extraout_RDX_00;
        goto LAB_001d62ed;
      }
    }
    kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::
    pre_order_iterator::operator--
              ((pre_order_iterator *)&rend_local.super_iterator_base.skip_current_children_);
  } while( true );
}

Assistant:

inline It rfindTag(It it, It rend, const std::string &tag)
{
    while (it != rend)
    {
        if (it->isTag()
                && (impl::icompare(it->tagName().c_str(), tag.c_str()) == 0))
            return it;
        --it;
    }
    return rend;
}